

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O1

nn_queue_item * nn_queue_pop(nn_queue *self)

{
  nn_queue_item *pnVar1;
  nn_queue_item *pnVar2;
  
  pnVar1 = self->head;
  if (pnVar1 != (nn_queue_item *)0x0) {
    pnVar2 = pnVar1->next;
    self->head = pnVar2;
    if (pnVar2 == (nn_queue_item *)0x0) {
      self->tail = (nn_queue_item *)0x0;
    }
    pnVar1->next = (nn_queue_item *)0xffffffffffffffff;
    return pnVar1;
  }
  return (nn_queue_item *)0x0;
}

Assistant:

struct nn_queue_item *nn_queue_pop (struct nn_queue *self)
{
    struct nn_queue_item *result;

    if (!self->head)
        return NULL;
    result = self->head;
    self->head = result->next;
    if (!self->head)
        self->tail = NULL;
    result->next = NN_QUEUE_NOTINQUEUE;
    return result;
}